

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMoves<(moira::Instr)132,(moira::Mode)6,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  Rn rn;
  Ea<(moira::Mode)6,_1> ea;
  Ea<(moira::Mode)6,_1> local_44;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar6 = (*this->_vptr_Moira[6])();
  Op<(moira::Mode)6,1>(&local_44,this,op & 7,addr);
  if (str->style->syntax != MUSASHI) {
    uVar8 = 0x1fe;
    if ((uVar6 & 0x7ff) != 0) {
      uVar8 = 0;
    }
    if ((uVar8 >> (this->dasmModel & 0x1f) & 1) == 0) {
      *addr = uVar1;
      dasmIllegal<(moira::Instr)132,(moira::Mode)6,1>(this,str,addr,op);
      return;
    }
  }
  rn.raw = (uVar6 & 0xffff) >> 0xc;
  cVar5 = 'm';
  lVar7 = 1;
  if (((uVar6 & 0xffff) >> 0xb & 1) == 0) {
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "fdmoves"[lVar7 + 2];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = 'b';
    }
    else {
      cVar5 = '.';
      lVar7 = 0;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = ".b"[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    StrWriter::operator<<(str,&local_44);
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    StrWriter::operator<<(str,rn);
  }
  else {
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "fdmoves"[lVar7 + 2];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = 'b';
    }
    else {
      cVar5 = '.';
      lVar7 = 0;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = ".b"[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    StrWriter::operator<<(str,rn);
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    StrWriter::operator<<(str,&local_44);
  }
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar5 = ';';
    lVar7 = 1;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "bkpt    #%d; (1+)"[lVar7 + 0xb];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmMoves(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = (u16)dasmIncRead<Word>(addr);
    auto ea = Op <M,S> ( _____________xxx(op), addr );
    auto rg = Rn ( xxxx____________(ext) );

    if (str.style.syntax != Syntax::MUSASHI && !isAvailable(dasmModel, I, M, S, ext)) {

        addr = old;
        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    if (ext & 0x800) {      // Rg -> Ea
        str << Ins<I>{} << Sz<S>{} << str.tab << rg << Sep{} << ea;
    } else {                // Ea -> Rg
        str << Ins<I>{} << Sz<S>{} << str.tab << ea << Sep{} << rg;
    }
    str << Av<I, M, S>{};
}